

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cGPUShaderFP64Tests.cpp
# Opt level: O3

void __thiscall
gl4cts::FunctionObject::
tenary<tcu::Vector<double,_3>,_const_tcu::Vector<double,_3>_&,_const_tcu::Vector<double,_3>_&,_const_tcu::Vector<double,_3>_&>
::call(tenary<tcu::Vector<double,_3>,_const_tcu::Vector<double,_3>_&,_const_tcu::Vector<double,_3>_&,_const_tcu::Vector<double,_3>_&>
       *this,GLvoid *result_dst,GLvoid *argument_src)

{
  GLuint i;
  GLuint argument;
  GLuint result;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  
  argument = 0;
  GPUShaderFP64Test10::functionObject::getArgumentStride((functionObject *)this,0);
  do {
    GPUShaderFP64Test10::functionObject::getArgumentStride((functionObject *)this,argument);
    argument = argument + 1;
  } while (argument != 2);
  (*(code *)(this->super_tenaryBase).super_functionObject.m_p_function)(&local_48);
  *(undefined8 *)((long)result_dst + 0x10) = local_38;
  *(undefined8 *)result_dst = local_48;
  *(undefined8 *)((long)result_dst + 8) = uStack_40;
  return;
}

Assistant:

virtual void call(glw::GLvoid* result_dst, const glw::GLvoid* argument_src) const
	{
		const glw::GLuint argument_2_offset = getArgumentOffset(1);
		const glw::GLuint argument_3_offset = getArgumentOffset(2);

		functionPointer p_function = (functionPointer)m_p_function;

		arg1T arg_1;
		arg2T arg_2;
		arg3T arg_3;
		ResT  result;

		unpack<arg1T>::get(argument_src, arg_1);
		unpack<arg2T>::get((glw::GLubyte*)argument_src + argument_2_offset, arg_2);
		unpack<arg3T>::get((glw::GLubyte*)argument_src + argument_3_offset, arg_3);

		result = p_function(arg_1, arg_2, arg_3);

		pack<ResT>::set(result_dst, result);
	}